

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,float power,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  uint uVar3;
  float *pfVar4;
  bool bVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float local_104;
  float local_100;
  float local_fc;
  float local_f8;
  float local_f4;
  float local_f0;
  bool local_e5;
  ImRect local_e4;
  ImRect local_d4;
  float local_c4;
  float local_c0;
  float grab_pos;
  float grab_t;
  ImVec2 local_b4;
  float local_ac;
  float local_a8;
  float v_new_off_round;
  float v_new_off_floor;
  float v_new_off_f;
  float a_1;
  float a;
  float v_new;
  int decimal_precision;
  float delta;
  ImVec2 delta2;
  float mouse_abs_pos;
  float clicked_t;
  bool set_new_value;
  bool value_changed;
  float linear_dist_max_to_0;
  float linear_dist_min_to_0;
  float linear_zero_pos;
  float slider_usable_pos_max;
  float slider_usable_pos_min;
  float slider_usable_sz;
  float v_range;
  float grab_sz;
  float slider_sz;
  float grab_padding;
  bool is_power;
  bool is_decimal;
  ImGuiAxis axis;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiSliderFlags flags_local;
  float power_local;
  char *format_local;
  float v_max_local;
  float v_min_local;
  float *v_local;
  ImGuiDataType data_type_local;
  ImGuiID id_local;
  ImRect *bb_local;
  
  pIVar1 = GImGui;
  uVar3 = (uint)((flags & 1U) != 0);
  bVar5 = data_type == 8;
  bVar6 = data_type == 9;
  local_e5 = bVar5 || bVar6;
  if ((power == 1.0) && (!NAN(power))) {
    local_e5 = false;
  }
  fVar7 = ImVec2::operator[](&bb->Max,(long)(int)uVar3);
  fVar8 = ImVec2::operator[](&bb->Min,(long)(int)uVar3);
  fVar7 = (fVar7 - fVar8) - 4.0;
  slider_usable_sz = (pIVar1->Style).GrabMinSize;
  if (v_max <= v_min) {
    local_f0 = v_min - v_max;
  }
  else {
    local_f0 = v_max - v_min;
  }
  if ((!bVar5 && !bVar6) && (0.0 <= local_f0)) {
    slider_usable_sz = ImMax<float>(fVar7 / (local_f0 + 1.0),(pIVar1->Style).GrabMinSize);
  }
  fVar8 = ImMin<float>(slider_usable_sz,fVar7);
  fVar9 = ImVec2::operator[](&bb->Min,(long)(int)uVar3);
  fVar9 = fVar8 * 0.5 + fVar9 + 2.0;
  fVar10 = ImVec2::operator[](&bb->Max,(long)(int)uVar3);
  if ((!local_e5) || (0.0 <= v_min * v_max)) {
    linear_dist_max_to_0 = (float)(-(uint)(v_min < 0.0) & 0x3f800000);
  }
  else {
    local_f4 = v_min;
    if (v_min < 0.0) {
      local_f4 = -v_min;
    }
    fVar11 = ImPow(local_f4,1.0 / power);
    local_f8 = v_max;
    if (v_max < 0.0) {
      local_f8 = -v_max;
    }
    fVar12 = ImPow(local_f8,1.0 / power);
    linear_dist_max_to_0 = fVar11 / (fVar11 + fVar12);
  }
  mouse_abs_pos._3_1_ = false;
  if (pIVar1->ActiveId == id) {
    bVar2 = false;
    delta2.y = 0.0;
    if (pIVar1->ActiveIdSource == ImGuiInputSource_Mouse) {
      if (((pIVar1->IO).MouseDown[0] & 1U) == 0) {
        ClearActiveID();
      }
      else {
        pfVar4 = ImVec2::operator[](&(pIVar1->IO).MousePos,(long)(int)uVar3);
        delta2.x = *pfVar4;
        if (fVar7 - fVar8 <= 0.0) {
          local_fc = 0.0;
        }
        else {
          local_fc = ImClamp<float>((delta2.x - fVar9) / (fVar7 - fVar8),0.0,1.0);
        }
        delta2.y = local_fc;
        if (uVar3 == 1) {
          delta2.y = 1.0 - local_fc;
        }
        bVar2 = true;
      }
    }
    else if (pIVar1->ActiveIdSource == ImGuiInputSource_Nav) {
      _decimal_precision = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      if (uVar3 == 0) {
        local_100 = (float)decimal_precision;
      }
      else {
        local_100 = -delta;
      }
      v_new = local_100;
      if ((pIVar1->NavActivatePressedId == id) && ((pIVar1->ActiveIdIsJustActivated & 1U) == 0)) {
        ClearActiveID();
      }
      else if ((local_100 != 0.0) || (NAN(local_100))) {
        delta2.y = SliderCalcRatioFromValueT<float,float>
                             (data_type,*v,v_min,v_max,power,linear_dist_max_to_0);
        if (bVar5 || bVar6) {
          local_104 = (float)ImParseFormatPrecision(format,3);
        }
        else {
          local_104 = 0.0;
        }
        a = local_104;
        if ((0 < (int)local_104) || (local_e5)) {
          v_new = v_new / 100.0;
          bVar2 = IsNavInputDown(0xe);
          if (bVar2) {
            v_new = v_new / 10.0;
          }
        }
        else if (((-100.0 <= local_f0) && (local_f0 <= 100.0)) ||
                (bVar2 = IsNavInputDown(0xe), bVar2)) {
          v_new = (float)(~-(uint)(v_new < 0.0) & 0x3f800000 | -(uint)(v_new < 0.0) & 0xbf800000) /
                  local_f0;
        }
        else {
          v_new = v_new / 100.0;
        }
        bVar2 = IsNavInputDown(0xf);
        if (bVar2) {
          v_new = v_new * 10.0;
        }
        bVar2 = true;
        if (((1.0 <= delta2.y) && (0.0 < v_new)) || ((delta2.y <= 0.0 && (v_new < 0.0)))) {
          bVar2 = false;
        }
        else {
          delta2.y = ImSaturate(delta2.y + v_new);
        }
      }
    }
    if (bVar2) {
      if (local_e5) {
        if (linear_dist_max_to_0 <= delta2.y) {
          fVar11 = ImFabs(linear_dist_max_to_0 - 1.0);
          if (fVar11 <= 1e-06) {
            v_new_off_floor = delta2.y;
          }
          else {
            v_new_off_floor = (delta2.y - linear_dist_max_to_0) / (1.0 - linear_dist_max_to_0);
          }
          v_new_off_floor = ImPow(v_new_off_floor,power);
          fVar11 = ImMax<float>(v_min,0.0);
          a_1 = ImLerp<float>(fVar11,v_max,v_new_off_floor);
        }
        else {
          v_new_off_f = 1.0 - delta2.y / linear_dist_max_to_0;
          v_new_off_f = ImPow(v_new_off_f,power);
          fVar11 = ImMin<float>(v_max,0.0);
          a_1 = ImLerp<float>(fVar11,v_min,v_new_off_f);
        }
      }
      else if (bVar5 || bVar6) {
        a_1 = ImLerp<float>(v_min,v_max,delta2.y);
      }
      else {
        local_a8 = (v_max - v_min) * delta2.y;
        local_ac = local_a8 + 0.5;
        fVar11 = local_a8;
        if (local_a8 < local_ac) {
          fVar11 = local_ac;
        }
        a_1 = v_min + fVar11;
        v_new_off_round = local_a8;
      }
      a_1 = RoundScalarWithFormatT<float,float>(format,data_type,a_1);
      if ((*v != a_1) || (NAN(*v) || NAN(a_1))) {
        *v = a_1;
        mouse_abs_pos._3_1_ = true;
      }
    }
  }
  if (1.0 <= fVar7) {
    local_c0 = SliderCalcRatioFromValueT<float,float>
                         (data_type,*v,v_min,v_max,power,linear_dist_max_to_0);
    if (uVar3 == 1) {
      local_c0 = 1.0 - local_c0;
    }
    local_c4 = ImLerp<float>(fVar9,-fVar8 * 0.5 + (fVar10 - 2.0),local_c0);
    if (uVar3 == 0) {
      ImRect::ImRect(&local_d4,-fVar8 * 0.5 + local_c4,(bb->Min).y + 2.0,fVar8 * 0.5 + local_c4,
                     (bb->Max).y - 2.0);
      out_grab_bb->Min = local_d4.Min;
      out_grab_bb->Max = local_d4.Max;
    }
    else {
      ImRect::ImRect(&local_e4,(bb->Min).x + 2.0,-fVar8 * 0.5 + local_c4,(bb->Max).x - 2.0,
                     fVar8 * 0.5 + local_c4);
      out_grab_bb->Min = local_e4.Min;
      out_grab_bb->Max = local_e4.Max;
    }
  }
  else {
    ImRect::ImRect((ImRect *)&grab_pos,&bb->Min,&bb->Min);
    out_grab_bb->Min = _grab_pos;
    out_grab_bb->Max = local_b4;
  }
  return mouse_abs_pos._3_1_;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, float power, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_power = (power != 1.0f) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    // For power curve sliders that cross over sign boundary we want the curve to be symmetric around 0.0f
    float linear_zero_pos;   // 0.0->1.0f
    if (is_power && v_min * v_max < 0.0f)
    {
        // Different sign
        const FLOATTYPE linear_dist_min_to_0 = ImPow(v_min >= 0 ? (FLOATTYPE)v_min : -(FLOATTYPE)v_min, (FLOATTYPE)1.0f / power);
        const FLOATTYPE linear_dist_max_to_0 = ImPow(v_max >= 0 ? (FLOATTYPE)v_max : -(FLOATTYPE)v_max, (FLOATTYPE)1.0f / power);
        linear_zero_pos = (float)(linear_dist_min_to_0 / (linear_dist_min_to_0 + linear_dist_max_to_0));
    }
    else
    {
        // Same sign
        linear_zero_pos = v_min < 0.0f ? 1.0f : 0.0f;
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            const ImVec2 delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float delta = (axis == ImGuiAxis_X) ? delta2.x : -delta2.y;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (delta != 0.0f)
            {
                clicked_t = SliderCalcRatioFromValueT<TYPE,FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if ((decimal_precision > 0) || is_power)
                {
                    delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        delta = ((delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    delta *= 10.0f;
                set_new_value = true;
                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                    set_new_value = false;
                else
                    clicked_t = ImSaturate(clicked_t + delta);
            }
        }

        if (set_new_value)
        {
            TYPE v_new;
            if (is_power)
            {
                // Account for power curve scale on both sides of the zero
                if (clicked_t < linear_zero_pos)
                {
                    // Negative: rescale to the negative range before powering
                    float a = 1.0f - (clicked_t / linear_zero_pos);
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMin(v_max, (TYPE)0), v_min, a);
                }
                else
                {
                    // Positive: rescale to the positive range before powering
                    float a;
                    if (ImFabs(linear_zero_pos - 1.0f) > 1.e-6f)
                        a = (clicked_t - linear_zero_pos) / (1.0f - linear_zero_pos);
                    else
                        a = clicked_t;
                    a = ImPow(a, power);
                    v_new = ImLerp(ImMax(v_min, (TYPE)0), v_max, a);
                }
            }
            else
            {
                // Linear slider
                if (is_decimal)
                {
                    v_new = ImLerp(v_min, v_max, clicked_t);
                }
                else
                {
                    // For integer values we want the clicking position to match the grab box so we round above
                    // This code is carefully tuned to work with large values (e.g. high ranges of U64) while preserving this property..
                    FLOATTYPE v_new_off_f = (v_max - v_min) * clicked_t;
                    TYPE v_new_off_floor = (TYPE)(v_new_off_f);
                    TYPE v_new_off_round = (TYPE)(v_new_off_f + (FLOATTYPE)0.5);
                    if (v_new_off_floor < v_new_off_round)
                        v_new = v_min + v_new_off_round;
                    else
                        v_new = v_min + v_new_off_floor;
                }
            }

            // Round to user desired precision based on format string
            v_new = RoundScalarWithFormatT<TYPE,SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = SliderCalcRatioFromValueT<TYPE, FLOATTYPE>(data_type, *v, v_min, v_max, power, linear_zero_pos);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}